

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

void __thiscall
capnp::LocalRequest::LocalRequest
          (LocalRequest *this,uint64_t interfaceId,uint16_t methodId,
          Maybe<capnp::MessageSize> *sizeHint,Own<capnp::ClientHook> *client)

{
  Own<capnp::ClientHook> *other;
  Maybe<capnp::MessageSize> local_50;
  uint local_34;
  Own<capnp::ClientHook> *local_30;
  Own<capnp::ClientHook> *client_local;
  Maybe<capnp::MessageSize> *sizeHint_local;
  uint64_t uStack_18;
  uint16_t methodId_local;
  uint64_t interfaceId_local;
  LocalRequest *this_local;
  
  local_30 = client;
  client_local = (Own<capnp::ClientHook> *)sizeHint;
  sizeHint_local._6_2_ = methodId;
  uStack_18 = interfaceId;
  interfaceId_local = (uint64_t)this;
  RequestHook::RequestHook(&this->super_RequestHook);
  (this->super_RequestHook)._vptr_RequestHook = (_func_int **)&PTR_send_00cd2388;
  kj::Maybe<capnp::MessageSize>::Maybe(&local_50,sizeHint);
  local_34 = firstSegmentSize(&local_50);
  kj::heap<capnp::MallocMessageBuilder,unsigned_int>((kj *)&this->message,&local_34);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_50);
  this->interfaceId = uStack_18;
  this->methodId = sizeHint_local._6_2_;
  other = kj::mv<kj::Own<capnp::ClientHook>>(client);
  kj::Own<capnp::ClientHook>::Own(&this->client,other);
  return;
}

Assistant:

inline LocalRequest(uint64_t interfaceId, uint16_t methodId,
                      kj::Maybe<MessageSize> sizeHint, kj::Own<ClientHook> client)
      : message(kj::heap<MallocMessageBuilder>(firstSegmentSize(sizeHint))),
        interfaceId(interfaceId), methodId(methodId), client(kj::mv(client)) {}